

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_err_t linear_hash_init(ion_dictionary_id_t id,ion_dictionary_size_t dictionary_size,
                          ion_key_type_t key_type,ion_key_size_t key_size,
                          ion_value_size_t value_size,int initial_size,int split_threshold,
                          int records_per_bucket,linear_hash_table_t *linear_hash)

{
  char cVar1;
  ion_err_t iVar2;
  ion_byte_t *piVar3;
  array_list_t *paVar4;
  ion_fpos_t *piVar5;
  FILE *pFVar6;
  int idx;
  char local_30 [12];
  char local_24 [12];
  
  (linear_hash->super).id = id;
  linear_hash->dictionary_size = dictionary_size;
  (linear_hash->super).key_type = key_type;
  (linear_hash->super).record.key_size = key_size;
  (linear_hash->super).record.value_size = value_size;
  linear_hash->initial_size = initial_size;
  linear_hash->num_buckets = initial_size;
  linear_hash->num_records = 0;
  linear_hash->next_split = 0;
  linear_hash->split_threshold = split_threshold;
  linear_hash->records_per_bucket = records_per_bucket;
  linear_hash->record_total_size = (long)(value_size + key_size) + 1;
  piVar3 = (ion_byte_t *)malloc(0x80);
  linear_hash->cache = piVar3;
  dictionary_get_filename(id,"lhd",local_24);
  dictionary_get_filename((linear_hash->super).id,"lhs",local_30);
  paVar4 = (array_list_t *)malloc(0x10);
  if (paVar4 != (array_list_t *)0x0) {
    paVar4->current_size = 5;
    piVar5 = (ion_fpos_t *)calloc(1,0x28);
    paVar4->data = piVar5;
    if (piVar5 != (ion_fpos_t *)0x0) {
      linear_hash->bucket_map = paVar4;
      pFVar6 = fopen(local_24,"r+b");
      linear_hash->database = (FILE *)pFVar6;
      if (pFVar6 == (FILE *)0x0) {
        pFVar6 = fopen(local_24,"w+b");
        linear_hash->database = (FILE *)pFVar6;
        if (pFVar6 == (FILE *)0x0) {
          return '\t';
        }
        if (0 < linear_hash->initial_size) {
          idx = 0;
          do {
            iVar2 = write_new_bucket(idx,linear_hash);
            if (iVar2 != '\0') {
              linear_hash_close(linear_hash);
              return iVar2;
            }
            idx = idx + 1;
          } while (idx < linear_hash->initial_size);
        }
      }
      pFVar6 = fopen(local_30,"r+b");
      linear_hash->state = (FILE *)pFVar6;
      if (pFVar6 == (FILE *)0x0) {
        pFVar6 = fopen(local_30,"w+b");
        linear_hash->state = (FILE *)pFVar6;
        if (pFVar6 == (FILE *)0x0) {
          return '\t';
        }
        cVar1 = linear_hash_write_state(linear_hash);
      }
      else {
        cVar1 = linear_hash_read_state(linear_hash);
      }
      if (cVar1 == '\0') {
        iVar2 = linear_hash_write_state(linear_hash);
        return iVar2;
      }
      return cVar1;
    }
  }
  linear_hash_close(linear_hash);
  return '\x06';
}

Assistant:

ion_err_t
linear_hash_init(
	ion_dictionary_id_t		id,
	ion_dictionary_size_t	dictionary_size,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	int						initial_size,
	int						split_threshold,
	int						records_per_bucket,
	linear_hash_table_t		*linear_hash
) {
	/* err */
	ion_err_t err;

	/* parameter not used */
	linear_hash->super.id					= id;
	linear_hash->dictionary_size			= dictionary_size;
	linear_hash->super.key_type				= key_type;
	linear_hash->super.record.key_size		= key_size;
	linear_hash->super.record.value_size	= value_size;

	/* initialize linear_hash fields */
	linear_hash->initial_size				= initial_size;
	linear_hash->num_buckets				= initial_size;
	linear_hash->num_records				= 0;
	linear_hash->next_split					= 0;
	linear_hash->split_threshold			= split_threshold;
	linear_hash->records_per_bucket			= records_per_bucket;
	linear_hash->record_total_size			= key_size + value_size + sizeof(ion_byte_t);
	linear_hash->cache						= malloc(128);

	char data_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhd", data_filename);

	char state_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhs", state_filename);

	/* mapping of buckets to file offsets */
	array_list_t *bucket_map;

	bucket_map = malloc(sizeof(array_list_t));

	if (NULL == bucket_map) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err_out_of_memory;
	}

	err = array_list_init(5, bucket_map);

	if (err != err_ok) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err;
	}

	linear_hash->bucket_map = bucket_map;
	linear_hash->database	= fopen(data_filename, "r+b");

	if (NULL == linear_hash->database) {
		linear_hash->database = fopen(data_filename, "w+b");

		if (NULL == linear_hash->database) {
			return err_file_open_error;
		}

		int i;

		for (i = 0; i < linear_hash->initial_size; i++) {
			err = write_new_bucket(i, linear_hash);

			if (err != err_ok) {
				linear_hash_close(linear_hash);
				return err;
			}
		}
	}

	linear_hash->state = fopen(state_filename, "r+b");

	if (NULL == linear_hash->state) {
		linear_hash->state = fopen(state_filename, "w+b");

		if (NULL == linear_hash->state) {
			return err_file_open_error;
		}

		err = linear_hash_write_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}
	else {
		err = linear_hash_read_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}

	err = linear_hash_write_state(linear_hash);

	if (err != err_ok) {
		return err;
	}

	/* return pointer to the linear_hash that is sitting in memory */
	return err_ok;
}